

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibLoaderFactory.h
# Opt level: O0

shared_ptr<util::LibraryLoader> util::LibLoaderFactory::getLoader(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<util::LibraryLoader> *in_RDI;
  shared_ptr<util::LibraryLoader> sVar1;
  shared_ptr<util::UnixLibLoader> local_20;
  
  std::make_shared<util::UnixLibLoader>();
  std::shared_ptr<util::LibraryLoader>::shared_ptr<util::UnixLibLoader,void>(in_RDI,&local_20);
  std::shared_ptr<util::UnixLibLoader>::~shared_ptr(&local_20);
  sVar1.super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<util::LibraryLoader>)
         sVar1.super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<LibraryLoader> getLoader() {
#ifdef WIN32
    return std::make_shared<WindowsLibLoader>();
#else
    return std::make_shared<UnixLibLoader>();
#endif
  }